

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kfindxx.cpp
# Opt level: O0

void parse_range(int *min,int *max,string *range)

{
  size_t sVar1;
  int iVar2;
  string local_78;
  string local_48;
  long local_28;
  size_t dash_pos;
  string *range_local;
  int *max_local;
  int *min_local;
  
  dash_pos = (size_t)range;
  range_local = (string *)max;
  max_local = min;
  local_28 = std::__cxx11::string::find((char)range,0x2d);
  if (local_28 == -1) {
    iVar2 = std::__cxx11::stoi((string *)dash_pos,(size_t *)0x0,10);
    *(int *)range_local = iVar2;
    *max_local = iVar2;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,dash_pos);
    iVar2 = std::__cxx11::stoi(&local_48,(size_t *)0x0,10);
    *max_local = iVar2;
    std::__cxx11::string::~string((string *)&local_48);
    sVar1 = dash_pos;
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_78,sVar1);
    iVar2 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
    *(int *)range_local = iVar2;
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void
parse_range(int& min, int& max, const std::string& range)
{
    std::size_t dash_pos = range.find('-');

    if (dash_pos == std::string::npos) {
        // Expecting single number.
        min = max = std::stoi(range);
    } else {
        // Expecting two numbers separated by a dash.
        min = std::stoi(range.substr(0, dash_pos));
        max = std::stoi(range.substr(dash_pos + 1, range.length() - dash_pos - 1));
    }
}